

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify-walker-impl.h
# Opt level: O0

void wasm::StringifyWalker<wasm::HashStringifyWalker>::scan
               (HashStringifyWalker *self,Expression **currp)

{
  Index *this;
  bool bVar1;
  Expression **currp_00;
  Iterator IVar2;
  Expression **child;
  undefined1 local_a8 [8];
  Iterator __end3;
  undefined1 local_78 [8];
  Iterator __begin3;
  ValueChildIterator *__range3;
  Expression *curr;
  Expression **currp_local;
  HashStringifyWalker *self_local;
  
  __range3 = (ValueChildIterator *)*currp;
  curr = (Expression *)currp;
  currp_local = (Expression **)self;
  bVar1 = Properties::isControlFlowStructure((Expression *)__range3);
  if (bVar1) {
    std::
    queue<wasm::Expression_*,_std::deque<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
    ::push((queue<wasm::Expression_*,_std::deque<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
            *)(currp_local + 0x1b),(value_type *)&__range3);
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::pushTask((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)currp_local,doVisitExpression,(Expression **)curr);
    this = &__begin3.index;
    ValueChildIterator::ValueChildIterator((ValueChildIterator *)this,(Expression *)__range3);
    IVar2 = AbstractChildIterator<wasm::ValueChildIterator>::begin
                      ((AbstractChildIterator<wasm::ValueChildIterator> *)this);
    __end3._8_8_ = IVar2.parent;
    __begin3.parent._0_4_ = IVar2.index;
    local_78 = (undefined1  [8])__end3._8_8_;
    IVar2 = AbstractChildIterator<wasm::ValueChildIterator>::end
                      ((AbstractChildIterator<wasm::ValueChildIterator> *)this);
    local_a8 = (undefined1  [8])IVar2.parent;
    __end3.parent._0_4_ = IVar2.index;
    while( true ) {
      bVar1 = AbstractChildIterator<wasm::ValueChildIterator>::Iterator::operator!=
                        ((Iterator *)local_78,(Iterator *)local_a8);
      if (!bVar1) break;
      currp_00 = AbstractChildIterator<wasm::ValueChildIterator>::Iterator::operator*
                           ((Iterator *)local_78);
      PostWalker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
      ::scan((HashStringifyWalker *)currp_local,currp_00);
      AbstractChildIterator<wasm::ValueChildIterator>::Iterator::operator++((Iterator *)local_78);
    }
    ValueChildIterator::~ValueChildIterator((ValueChildIterator *)&__begin3.index);
  }
  else {
    PostWalker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::scan((HashStringifyWalker *)currp_local,(Expression **)curr);
  }
  return;
}

Assistant:

inline void StringifyWalker<SubType>::scan(SubType* self, Expression** currp) {
  Expression* curr = *currp;
  if (Properties::isControlFlowStructure(curr)) {
    self->controlFlowQueue.push(curr);
    DBG(std::cerr << "controlFlowQueue.push: " << ShallowExpression{curr}
                  << ", " << curr << "\n");
    self->pushTask(doVisitExpression, currp);
    // The if-condition is a value child consumed by the if control flow, which
    // makes the if-condition a true sibling rather than part of its contents in
    // the binary format
    for (auto*& child : ValueChildIterator(curr)) {
      Super::scan(self, &child);
    }
  } else {
    Super::scan(self, currp);
  }
}